

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O3

void __thiscall LineModel::printLineParam(LineModel *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"best_model.A =  ",0x10);
  poVar1 = std::ostream::_M_insert<double>(this->A_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  best_model.B =  ",0x12);
  poVar1 = std::ostream::_M_insert<double>(this->B_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," best_model.C=  ",0x10);
  poVar1 = std::ostream::_M_insert<double>(this->C_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printLineParam()
	{
		cout << "best_model.A =  "<< A_<< endl
			<<"  best_model.B =  " <<B_ <<endl
			<< " best_model.C=  "<<C_<< endl;
	}